

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

int __thiscall FileTokenizer::init(FileTokenizer *this,EVP_PKEY_CTX *ctx)

{
  ulong uVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  bool bVar4;
  undefined7 extraout_var;
  allocator<char> local_189;
  Token *local_188;
  string *local_180;
  TextFile *local_178;
  string local_170;
  Token local_150;
  Token local_f0;
  Token local_90;
  int iVar5;
  
  std::__cxx11::list<Token,_std::allocator<Token>_>::clear
            ((list<Token,_std::allocator<Token>_> *)this);
  this->lineNumber = 1;
  this->linePos = 0;
  this->equActive = false;
  TextFile::readLine_abi_cxx11_(&local_170,(TextFile *)ctx);
  local_180 = (string *)&this->currentLine;
  std::__cxx11::string::operator=(local_180,(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  this->input = (TextFile *)ctx;
  bVar3 = TextFile::isOpen((TextFile *)ctx);
  iVar5 = (int)CONCAT71(extraout_var,bVar3);
  if (bVar3) {
    local_188 = &this->token;
    local_178 = (TextFile *)ctx;
LAB_001458a5:
    while (bVar4 = isInputAtEnd(this), !bVar4) {
      skipWhitespace(this);
      uVar1 = this->linePos;
      if ((this->currentLine)._M_string_length <= uVar1) goto LAB_001459bb;
      if (*(char *)(*(long *)local_180 + uVar1) != '\\') goto LAB_00145989;
      this->linePos = uVar1 + 1;
      skipWhitespace(this);
      if (this->linePos < (this->currentLine)._M_string_length) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"Unexpected character after line continuation character",
                   &local_189);
        createToken(this,Invalid,0,&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        Token::Token(&local_90,local_188);
        std::__cxx11::list<Token,_std::allocator<Token>_>::push_back
                  ((list<Token,_std::allocator<Token>_> *)this,&local_90);
        Token::~Token(&local_90);
        ctx = (EVP_PKEY_CTX *)local_178;
      }
      if ((this->currentLine)._M_string_length <= this->linePos) goto LAB_001459ed;
    }
LAB_00145a2d:
    p_Var2 = (this->super_Tokenizer).tokens.super__List_base<Token,_std::allocator<Token>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    (this->super_Tokenizer).position.it._M_node = p_Var2;
    iVar5 = (int)CONCAT71((int7)((ulong)p_Var2 >> 8),bVar3);
  }
  return iVar5;
LAB_00145989:
  loadToken(&local_f0,this);
  std::__cxx11::list<Token,_std::allocator<Token>_>::push_back
            ((list<Token,_std::allocator<Token>_> *)this,&local_f0);
  Token::~Token(&local_f0);
  if ((this->currentLine)._M_string_length <= this->linePos) {
LAB_001459bb:
    createToken(this,Separator,0);
    Token::Token(&local_150,local_188);
    std::__cxx11::list<Token,_std::allocator<Token>_>::push_back
              ((list<Token,_std::allocator<Token>_> *)this,&local_150);
    Token::~Token(&local_150);
LAB_001459ed:
    bVar4 = TextFile::atEnd((TextFile *)ctx);
    if (bVar4) goto LAB_00145a2d;
    TextFile::readLine_abi_cxx11_(&local_170,(TextFile *)ctx);
    std::__cxx11::string::operator=(local_180,(string *)&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    this->linePos = 0;
    this->lineNumber = this->lineNumber + 1;
  }
  goto LAB_001458a5;
}

Assistant:

bool FileTokenizer::init(TextFile* input)
{
	clearTokens();

	lineNumber = 1;
	linePos = 0;
	equActive = false;
	currentLine = input->readLine();

	this->input = input;
	if (input != nullptr && input->isOpen())
	{
		while (!isInputAtEnd())
		{
			bool addSeparator = true;

			skipWhitespace();
			if (isContinuation(currentLine, linePos))
			{
				linePos++;
				skipWhitespace();
				if (linePos < currentLine.size())
				{
					createToken(TokenType::Invalid,0,
						"Unexpected character after line continuation character");
					addToken(token);
				}

				addSeparator = false;
			} else if(linePos < currentLine.size())
			{
				addToken(loadToken());
			}

			if (linePos >= currentLine.size())
			{
				if (addSeparator)
				{
					createToken(TokenType::Separator,0);
					addToken(token);
				}

				if (input->atEnd())
					break;

				currentLine = input->readLine();
				linePos = 0;
				lineNumber++;
			}
		}

		resetPosition();
		return true;
	}

	return false;
}